

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# token.c
# Opt level: O0

void wp_token_consume_decimal_digits(w_tokenizer *tokenizer)

{
  bool bVar1;
  w_tokenizer *tokenizer_local;
  
  if (tokenizer == (w_tokenizer *)0x0) {
    w_handle_failed_assertion
              ("tokenizer != NULL","wp_token_consume_decimal_digits",
               "/workspace/llm4binary/github/license_all_cmakelists_25/christophercrouzet[P]uuki/src/lang/token.c"
               ,0xbf);
  }
  if (tokenizer->it == (char *)0x0) {
    w_handle_failed_assertion
              ("tokenizer->it != NULL","wp_token_consume_decimal_digits",
               "/workspace/llm4binary/github/license_all_cmakelists_25/christophercrouzet[P]uuki/src/lang/token.c"
               ,0xc0);
  }
  while( true ) {
    bVar1 = false;
    if ('/' < *tokenizer->it) {
      bVar1 = *tokenizer->it < ':';
    }
    if (!bVar1) break;
    wp_token_advance_iter(tokenizer);
  }
  return;
}

Assistant:

static void
wp_token_consume_decimal_digits(
    struct w_tokenizer *tokenizer
)
{
    W_ASSERT(tokenizer != NULL);
    W_ASSERT(tokenizer->it != NULL);

    while (*tokenizer->it >= '0' && *tokenizer->it <= '9')
    {
        wp_token_advance_iter(tokenizer);
    }
}